

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void flip_level_rnd(level *lev,int flp)

{
  int iVar1;
  undefined4 local_18;
  int c;
  int flp_local;
  level *lev_local;
  
  local_18 = 0;
  if ((flp & 1U) != 0) {
    iVar1 = rn2(2);
    if (iVar1 != 0) {
      local_18 = 1;
    }
  }
  if ((flp & 2U) != 0) {
    iVar1 = rn2(2);
    if (iVar1 != 0) {
      local_18 = local_18 | 2;
    }
  }
  flip_level(lev,local_18);
  return;
}

Assistant:

static void flip_level_rnd(struct level *lev, int flp)
{
	int c = 0;
	if ((flp & 1) && rn2(2)) c |= 1;
	if ((flp & 2) && rn2(2)) c |= 2;
	flip_level(lev, c);
}